

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall
helics::MessageFederate::MessageFederate(MessageFederate *this,void **vtt,char *configString)

{
  string_view fedName;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  void **vtt_00;
  MessageFederate *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  string *local_18;
  
  local_18 = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28);
  vtt_00 = (void **)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fedName._M_str = (char *)in_stack_ffffffffffffffb0;
  fedName._M_len = in_stack_ffffffffffffffa8;
  MessageFederate(in_stack_ffffffffffffffa0,vtt_00,fedName,local_18);
  std::__cxx11::string::~string(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return;
}

Assistant:

MessageFederate::MessageFederate(const char* configString):
    MessageFederate(std::string_view{}, std::string{configString})
{
}